

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O0

int lreadstdin(lua_State *L)

{
  char *s;
  int iVar1;
  pthread_mutex_t *__mutex;
  char *str;
  queue_conflict *q;
  lua_State *L_local;
  
  __mutex = (pthread_mutex_t *)lua_touserdata(L,-0xf4629);
  pthread_mutex_lock(__mutex);
  if (__mutex[1].__data.__lock == *(int *)((long)__mutex + 0x2c)) {
    pthread_mutex_unlock(__mutex);
    L_local._4_4_ = 0;
  }
  else {
    s = *(char **)((long)__mutex + (long)__mutex[1].__data.__lock * 8 + 0x30);
    iVar1 = __mutex[1].__data.__lock + 1;
    __mutex[1].__data.__lock = iVar1;
    if (0x3ff < iVar1) {
      __mutex[1].__data.__lock = 0;
    }
    pthread_mutex_unlock(__mutex);
    lua_pushstring(L,s);
    free(s);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
lreadstdin(lua_State *L) {
	struct queue *q = lua_touserdata(L, lua_upvalueindex(1));
	pthread_mutex_lock(&q->lock);
	if (q->head == q->tail) {
		pthread_mutex_unlock(&q->lock);
		return 0;
	}
	char * str = q->queue[q->head];
	if (++q->head >= QUEUE_SIZE) {
		q->head = 0;
	}
	pthread_mutex_unlock(&q->lock);
	lua_pushstring(L, str);
	free(str);
	return 1;
}